

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O2

void __thiscall amount_tests::GetFeeTest::test_method(GetFeeTest *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  assertion_result *paVar2;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  char **ppcVar4;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  char *local_970;
  char *local_968;
  undefined1 *local_960;
  undefined1 *local_958;
  char *local_950;
  char *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  CAmount local_590;
  CFeeRate local_588;
  assertion_result local_580;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 *local_538;
  undefined1 *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  undefined1 *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  lazy_ostream local_88;
  undefined1 *local_78;
  char **local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  CFeeRate altFeeRate;
  CFeeRate local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  altFeeRate.nSatoshisPerK = 0;
  local_40.nSatoshisPerK = 0;
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1d;
  file.m_begin = (iterator)&local_58;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_68,msg);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_90 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0);
  paVar2 = &local_580;
  local_5a0 = (char *)0x0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_98,0x1d,1,2,paVar2,"feeRate.GetFee(0)",&local_5a0,"CAmount(0)");
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1e;
  file_00.m_begin = (iterator)&local_a8;
  msg_00.m_end = (iterator)paVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_b8,msg_00
            );
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_c0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,100000);
  paVar2 = &local_580;
  local_5a0 = (char *)0x0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_c8,0x1e,1,2,paVar2,"feeRate.GetFee(1e5)",&local_5a0,"CAmount(0)");
  local_40.nSatoshisPerK = 1000;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = &DAT_00000022;
  file_01.m_begin = (iterator)&local_d8;
  msg_01.m_end = (iterator)paVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_e8,msg_01
            );
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_f0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0);
  paVar2 = &local_580;
  local_5a0 = (char *)0x0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_f8,0x22,1,2,paVar2,"feeRate.GetFee(0)",&local_5a0,"CAmount(0)");
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x23;
  file_02.m_begin = (iterator)&local_108;
  msg_02.m_end = (iterator)paVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_118,
             msg_02);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_120 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,1);
  paVar2 = &local_580;
  local_5a0 = (char *)0x1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_128,0x23,1,2,paVar2,"feeRate.GetFee(1)",&local_5a0,"CAmount(1)");
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x24;
  file_03.m_begin = (iterator)&local_138;
  msg_03.m_end = (iterator)paVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_148,
             msg_03);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_150 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0x79);
  paVar2 = &local_580;
  local_5a0 = (char *)0x79;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_158,0x24,1,2,paVar2,"feeRate.GetFee(121)",&local_5a0,"CAmount(121)");
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x25;
  file_04.m_begin = (iterator)&local_168;
  msg_04.m_end = (iterator)paVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_178,
             msg_04);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_180 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,999);
  paVar2 = &local_580;
  local_5a0 = (char *)0x3e7;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_188,0x25,1,2,paVar2,"feeRate.GetFee(999)",&local_5a0,"CAmount(999)");
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x26;
  file_05.m_begin = (iterator)&local_198;
  msg_05.m_end = (iterator)paVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1a8,
             msg_05);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1b0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,1000);
  paVar2 = &local_580;
  local_5a0 = (char *)0x3e8;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_1b8,0x26,1,2,paVar2,"feeRate.GetFee(1e3)",&local_5a0,"CAmount(1e3)");
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x27;
  file_06.m_begin = (iterator)&local_1c8;
  msg_06.m_end = (iterator)paVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_1d8,
             msg_06);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1e0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,9000);
  paVar2 = &local_580;
  local_5a0 = (char *)0x2328;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_1e8,0x27,1,2,paVar2,"feeRate.GetFee(9e3)",&local_5a0,"CAmount(9e3)");
  local_40.nSatoshisPerK = -1000;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x2b;
  file_07.m_begin = (iterator)&local_1f8;
  msg_07.m_end = (iterator)paVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_208,
             msg_07);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_210 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0);
  paVar2 = &local_580;
  local_5a0 = (char *)0x0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_218,0x2b,1,2,paVar2,"feeRate.GetFee(0)",&local_5a0,"CAmount(0)");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2c;
  file_08.m_begin = (iterator)&local_228;
  msg_08.m_end = (iterator)paVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_238,
             msg_08);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_240 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,1);
  paVar2 = &local_580;
  local_5a0 = (char *)0xffffffffffffffff;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_248,0x2c,1,2,paVar2,"feeRate.GetFee(1)",&local_5a0,"CAmount(-1)");
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2d;
  file_09.m_begin = (iterator)&local_258;
  msg_09.m_end = (iterator)paVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_268,
             msg_09);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_270 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0x79);
  paVar2 = &local_580;
  local_5a0 = (char *)0xffffffffffffff87;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_278,0x2d,1,2,paVar2,"feeRate.GetFee(121)",&local_5a0,"CAmount(-121)");
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2e;
  file_10.m_begin = (iterator)&local_288;
  msg_10.m_end = (iterator)paVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_298,
             msg_10);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2a0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,999);
  paVar2 = &local_580;
  local_5a0 = (char *)0xfffffffffffffc19;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_2a8,0x2e,1,2,paVar2,"feeRate.GetFee(999)",&local_5a0,"CAmount(-999)");
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x2f;
  file_11.m_begin = (iterator)&local_2b8;
  msg_11.m_end = (iterator)paVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2c8,
             msg_11);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2d0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,1000);
  paVar2 = &local_580;
  local_5a0 = (char *)0xfffffffffffffc18;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_2d8,0x2f,1,2,paVar2,"feeRate.GetFee(1e3)",&local_5a0,"CAmount(-1e3)");
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x30;
  file_12.m_begin = (iterator)&local_2e8;
  msg_12.m_end = (iterator)paVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_2f8,
             msg_12);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_300 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,9000);
  paVar2 = &local_580;
  local_5a0 = (char *)0xffffffffffffdcd8;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_308,0x30,1,2,paVar2,"feeRate.GetFee(9e3)",&local_5a0,"CAmount(-9e3)");
  local_40.nSatoshisPerK = 0x7b;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x34;
  file_13.m_begin = (iterator)&local_318;
  msg_13.m_end = (iterator)paVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_328,
             msg_13);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_330 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0);
  paVar2 = &local_580;
  local_5a0 = (char *)0x0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_338,0x34,1,2,paVar2,"feeRate.GetFee(0)",&local_5a0,"CAmount(0)");
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x35;
  file_14.m_begin = (iterator)&local_348;
  msg_14.m_end = (iterator)paVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_358,
             msg_14);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_360 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,8);
  paVar2 = &local_580;
  local_5a0 = (char *)0x1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_368,0x35,1,2,paVar2,"feeRate.GetFee(8)",&local_5a0,"CAmount(1)");
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x36;
  file_15.m_begin = (iterator)&local_378;
  msg_15.m_end = (iterator)paVar2;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_388,
             msg_15);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_390 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,9);
  paVar2 = &local_580;
  local_5a0 = (char *)0x2;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_398,0x36,1,2,paVar2,"feeRate.GetFee(9)",&local_5a0,"CAmount(2)");
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x37;
  file_16.m_begin = (iterator)&local_3a8;
  msg_16.m_end = (iterator)paVar2;
  msg_16.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_3b8,
             msg_16);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3c0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0x79);
  paVar2 = &local_580;
  local_5a0 = (char *)0xf;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_3c8,0x37,1,2,paVar2,"feeRate.GetFee(121)",&local_5a0,"CAmount(15)");
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x38;
  file_17.m_begin = (iterator)&local_3d8;
  msg_17.m_end = (iterator)paVar2;
  msg_17.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_3e8,
             msg_17);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_3f0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0x7a);
  paVar2 = &local_580;
  local_5a0 = (char *)0x10;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_3f8,0x38,1,2,paVar2,"feeRate.GetFee(122)",&local_5a0,"CAmount(16)");
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x39;
  file_18.m_begin = (iterator)&local_408;
  msg_18.m_end = (iterator)paVar2;
  msg_18.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_418,
             msg_18);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_420 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,999);
  paVar2 = &local_580;
  local_5a0 = (char *)0x7b;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_428,0x39,1,2,paVar2,"feeRate.GetFee(999)",&local_5a0,"CAmount(123)");
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3a;
  file_19.m_begin = (iterator)&local_438;
  msg_19.m_end = (iterator)paVar2;
  msg_19.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_448,
             msg_19);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_450 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,1000);
  paVar2 = &local_580;
  local_5a0 = (char *)0x7b;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_458,0x3a,1,2,paVar2,"feeRate.GetFee(1e3)",&local_5a0,"CAmount(123)");
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x3b;
  file_20.m_begin = (iterator)&local_468;
  msg_20.m_end = (iterator)paVar2;
  msg_20.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_478,
             msg_20);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_480 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,9000);
  paVar2 = &local_580;
  local_5a0 = (char *)0x453;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_488,0x3b,1,2,paVar2,"feeRate.GetFee(9e3)",&local_5a0,"CAmount(1107)");
  local_40.nSatoshisPerK = -0x7b;
  local_498 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x3f;
  file_21.m_begin = (iterator)&local_498;
  msg_21.m_end = (iterator)paVar2;
  msg_21.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4a8,
             msg_21);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4b0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,0);
  paVar2 = &local_580;
  local_5a0 = (char *)0x0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_4b8,0x3f,1,2,paVar2,"feeRate.GetFee(0)",&local_5a0,"CAmount(0)");
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4c0 = "";
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x40;
  file_22.m_begin = (iterator)&local_4c8;
  msg_22.m_end = (iterator)paVar2;
  msg_22.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_4d8,
             msg_22);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_4e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4e0 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,8);
  paVar2 = &local_580;
  local_5a0 = (char *)0xffffffffffffffff;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_4e8,0x40,1,2,paVar2,"feeRate.GetFee(8)",&local_5a0,"CAmount(-1)");
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x41;
  file_23.m_begin = (iterator)&local_4f8;
  msg_23.m_end = (iterator)paVar2;
  msg_23.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_508,
             msg_23);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_518 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_510 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,9);
  paVar2 = &local_580;
  local_5a0 = (char *)0xffffffffffffffff;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_518,0x41,1,2,paVar2,"feeRate.GetFee(9)",&local_5a0,"CAmount(-1)");
  local_40.nSatoshisPerK = 1000;
  altFeeRate.nSatoshisPerK = 1000;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_520 = "";
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x46;
  file_24.m_begin = (iterator)&local_528;
  msg_24.m_end = (iterator)paVar2;
  msg_24.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_538,
             msg_24);
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = (char **)0xc7f1cc;
  local_548 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_540 = "";
  local_580._0_8_ = CFeeRate::GetFee(&local_40,100);
  local_5a0 = (char *)CFeeRate::GetFee(&altFeeRate,100);
  pvVar1 = (iterator)0x2;
  paVar2 = &local_580;
  ppcVar4 = &local_5a0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (&local_88,&local_548,0x46,1,2,paVar2,"feeRate.GetFee(100)",&local_5a0,
             "altFeeRate.GetFee(100)");
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_550 = "";
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x49;
  file_25.m_begin = (iterator)&local_558;
  msg_25.m_end = (iterator)paVar2;
  msg_25.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_568,
             msg_25);
  local_590 = -1;
  CFeeRate::CFeeRate(&local_588,&local_590,0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(-1), 0) == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5a8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_588.nSatoshisPerK == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_5b0,0x49);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x4a;
  file_26.m_begin = (iterator)&local_5c0;
  msg_26.m_end = pvVar3;
  msg_26.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_5d0,
             msg_26);
  local_590 = 0;
  CFeeRate::CFeeRate(&local_588,&local_590,0);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(0), 0) == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5d8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_5e0,0x4a);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x4b;
  file_27.m_begin = (iterator)&local_5f0;
  msg_27.m_end = pvVar3;
  msg_27.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_600,
             msg_27);
  local_590 = 1;
  CFeeRate::CFeeRate(&local_588,&local_590,0);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(1), 0) == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_608 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_610,0x4b);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x4d;
  file_28.m_begin = (iterator)&local_620;
  msg_28.m_end = pvVar3;
  msg_28.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_630,
             msg_28);
  local_590 = -1;
  CFeeRate::CFeeRate(&local_588,&local_590,1000);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == -1);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(-1), 1000) == CFeeRate(-1)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_638 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_640,0x4d);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x4e;
  file_29.m_begin = (iterator)&local_650;
  msg_29.m_end = pvVar3;
  msg_29.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_660,
             msg_29);
  local_590 = 0;
  CFeeRate::CFeeRate(&local_588,&local_590,1000);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(0), 1000) == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_668 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_670,0x4e);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x4f;
  file_30.m_begin = (iterator)&local_680;
  msg_30.m_end = pvVar3;
  msg_30.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_690,
             msg_30);
  local_590 = 1;
  CFeeRate::CFeeRate(&local_588,&local_590,1000);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 1);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(1), 1000) == CFeeRate(1)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_698 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_6a0,0x4f);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x51;
  file_31.m_begin = (iterator)&local_6b0;
  msg_31.m_end = pvVar3;
  msg_31.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_6c0,
             msg_31);
  local_590 = 1;
  CFeeRate::CFeeRate(&local_588,&local_590,0x3e9);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(1), 1001) == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6c8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_6d0,0x51);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x52;
  file_32.m_begin = (iterator)&local_6e0;
  msg_32.m_end = pvVar3;
  msg_32.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_6f0,
             msg_32);
  local_590 = 2;
  CFeeRate::CFeeRate(&local_588,&local_590,0x3e9);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 1);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(2), 1001) == CFeeRate(1)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_6f8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_700,0x52);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x54;
  file_33.m_begin = (iterator)&local_710;
  msg_33.m_end = pvVar3;
  msg_33.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_720,
             msg_33);
  local_590 = 0x1a;
  CFeeRate::CFeeRate(&local_588,&local_590,0x315);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 0x20);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(26), 789) == CFeeRate(32)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_730 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_728 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_730,0x54);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x55;
  file_34.m_begin = (iterator)&local_740;
  msg_34.m_end = pvVar3;
  msg_34.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_750,
             msg_34);
  local_590 = 0x1b;
  CFeeRate::CFeeRate(&local_588,&local_590,0x315);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_588.nSatoshisPerK == 0x22);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "CFeeRate(CAmount(27), 789) == CFeeRate(34)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_70 = &local_5a0;
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_758 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_760,0x55);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  CFeeRate::CFeeRate((CFeeRate *)&local_88,&MAX_MONEY,0xffffffff);
  local_40.nSatoshisPerK = 1000;
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x5c;
  file_35.m_begin = (iterator)&local_770;
  msg_35.m_end = pvVar3;
  msg_35.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_780,
             msg_35);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "0 * feeRate == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_788 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_790,0x5c);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x5d;
  file_36.m_begin = (iterator)&local_7a0;
  msg_36.m_end = pvVar3;
  msg_36.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_7b0,
             msg_36);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "feeRate * 0 == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7b8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_7c0,0x5d);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x5f;
  file_37.m_begin = (iterator)&local_7d0;
  msg_37.m_end = pvVar3;
  msg_37.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_7e0,
             msg_37);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 1000);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "3 * feeRate == CFeeRate(3000)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7e8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_7f0,0x5f);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x60;
  file_38.m_begin = (iterator)&local_800;
  msg_38.m_end = pvVar3;
  msg_38.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_810,
             msg_38);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 1000);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "feeRate * 3 == CFeeRate(3000)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_818 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_820,0x60);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x62;
  file_39.m_begin = (iterator)&local_830;
  msg_39.m_end = pvVar3;
  msg_39.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_840,
             msg_39);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 1000);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "-3 * feeRate == CFeeRate(-3000)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_848 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_850,0x62);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x63;
  file_40.m_begin = (iterator)&local_860;
  msg_40.m_end = pvVar3;
  msg_40.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_870,
             msg_40);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 1000);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "feeRate * -3 == CFeeRate(-3000)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_878 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_880,99);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_890 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x65;
  file_41.m_begin = (iterator)&local_890;
  msg_41.m_end = pvVar3;
  msg_41.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_8a0,
             msg_41);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "2 * feeRate == feeRate * 2";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_8b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_8a8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_8b0,0x65);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_8c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = &DAT_00000068;
  file_42.m_begin = (iterator)&local_8c0;
  msg_42.m_end = pvVar3;
  msg_42.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_8d0,
             msg_42);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "largeNumber * feeRate == feeRate * largeNumber";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_8e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_8d8 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_8e0,0x68);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_40.nSatoshisPerK = 0x7fffffff;
  local_8f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x6c;
  file_43.m_begin = (iterator)&local_8f0;
  msg_43.m_end = pvVar3;
  msg_43.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_900,
             msg_43);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 0x7fffffff);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "feeRate * 2 == CFeeRate(static_cast<int64_t>(maxInt) * 2)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_910 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_908 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_910,0x6c);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_920 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x6d;
  file_44.m_begin = (iterator)&local_920;
  msg_44.m_end = pvVar3;
  msg_44.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_930,
             msg_44);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 0x7fffffff);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "2 * feeRate == CFeeRate(static_cast<int64_t>(maxInt) * 2)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_940 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_938 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_940,0x6d);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_40.nSatoshisPerK = 0;
  local_950 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_948 = "";
  local_960 = &boost::unit_test::basic_cstring<char_const>::null;
  local_958 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x70;
  file_45.m_begin = (iterator)&local_950;
  msg_45.m_end = pvVar3;
  msg_45.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_960,
             msg_45);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40.nSatoshisPerK == 0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "feeRate * 5 == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_970 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_968 = "";
  pvVar1 = &DAT_00000001;
  pvVar3 = (iterator)0x0;
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_970,0x70);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  local_980 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x71;
  file_46.m_begin = (iterator)&local_980;
  msg_46.m_end = pvVar3;
  msg_46.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_990,
             msg_46);
  local_580.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_40.nSatoshisPerK == 0);
  local_580.m_message.px = (element_type *)0x0;
  local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5a0 = "5 * feeRate == CFeeRate(0)";
  local_598 = "";
  local_88.m_empty = false;
  local_88._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_78 = boost::unit_test::lazy_ostream::inst;
  local_9a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_998 = "";
  local_70 = &local_5a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_580,&local_88,1,0,WARN,(check_type)ppcVar4,(size_t)&local_9a0,0x71);
  boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(GetFeeTest)
{
    CFeeRate feeRate, altFeeRate;

    feeRate = CFeeRate(0);
    // Must always return 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e5), CAmount(0));

    feeRate = CFeeRate(1000);
    // Must always just return the arg
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1), CAmount(1));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(121));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(999));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(1e3));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(9e3));

    feeRate = CFeeRate(-1000);
    // Must always just return -1 * arg
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1), CAmount(-1));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(-121));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(-999));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(-1e3));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(-9e3));

    feeRate = CFeeRate(123);
    // Rounds up the result, if not integer
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(8), CAmount(1)); // Special case: returns 1 instead of 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(9), CAmount(2));
    BOOST_CHECK_EQUAL(feeRate.GetFee(121), CAmount(15));
    BOOST_CHECK_EQUAL(feeRate.GetFee(122), CAmount(16));
    BOOST_CHECK_EQUAL(feeRate.GetFee(999), CAmount(123));
    BOOST_CHECK_EQUAL(feeRate.GetFee(1e3), CAmount(123));
    BOOST_CHECK_EQUAL(feeRate.GetFee(9e3), CAmount(1107));

    feeRate = CFeeRate(-123);
    // Truncates the result, if not integer
    BOOST_CHECK_EQUAL(feeRate.GetFee(0), CAmount(0));
    BOOST_CHECK_EQUAL(feeRate.GetFee(8), CAmount(-1)); // Special case: returns -1 instead of 0
    BOOST_CHECK_EQUAL(feeRate.GetFee(9), CAmount(-1));

    // check alternate constructor
    feeRate = CFeeRate(1000);
    altFeeRate = CFeeRate(feeRate);
    BOOST_CHECK_EQUAL(feeRate.GetFee(100), altFeeRate.GetFee(100));

    // Check full constructor
    BOOST_CHECK(CFeeRate(CAmount(-1), 0) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(0), 0) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(1), 0) == CFeeRate(0));
    // default value
    BOOST_CHECK(CFeeRate(CAmount(-1), 1000) == CFeeRate(-1));
    BOOST_CHECK(CFeeRate(CAmount(0), 1000) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(1), 1000) == CFeeRate(1));
    // lost precision (can only resolve satoshis per kB)
    BOOST_CHECK(CFeeRate(CAmount(1), 1001) == CFeeRate(0));
    BOOST_CHECK(CFeeRate(CAmount(2), 1001) == CFeeRate(1));
    // some more integer checks
    BOOST_CHECK(CFeeRate(CAmount(26), 789) == CFeeRate(32));
    BOOST_CHECK(CFeeRate(CAmount(27), 789) == CFeeRate(34));
    // Maximum size in bytes, should not crash
    CFeeRate(MAX_MONEY, std::numeric_limits<uint32_t>::max()).GetFeePerK();

    // check multiplication operator
    // check multiplying by zero
    feeRate = CFeeRate(1000);
    BOOST_CHECK(0 * feeRate == CFeeRate(0));
    BOOST_CHECK(feeRate * 0 == CFeeRate(0));
    // check multiplying by a positive integer
    BOOST_CHECK(3 * feeRate == CFeeRate(3000));
    BOOST_CHECK(feeRate * 3 == CFeeRate(3000));
    // check multiplying by a negative integer
    BOOST_CHECK(-3 * feeRate == CFeeRate(-3000));
    BOOST_CHECK(feeRate * -3 == CFeeRate(-3000));
    // check commutativity
    BOOST_CHECK(2 * feeRate == feeRate * 2);
    // check with large numbers
    int largeNumber = 1000000;
    BOOST_CHECK(largeNumber * feeRate == feeRate * largeNumber);
    // check boundary values
    int maxInt = std::numeric_limits<int>::max();
    feeRate = CFeeRate(maxInt);
    BOOST_CHECK(feeRate * 2 == CFeeRate(static_cast<int64_t>(maxInt) * 2));
    BOOST_CHECK(2 * feeRate == CFeeRate(static_cast<int64_t>(maxInt) * 2));
    // check with zero fee rate
    feeRate = CFeeRate(0);
    BOOST_CHECK(feeRate * 5 == CFeeRate(0));
    BOOST_CHECK(5 * feeRate == CFeeRate(0));
}